

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::ExtPubkey::GetFingerprintData(ByteData *__return_storage_ptr__,ExtPubkey *this)

{
  value_type vVar1;
  uint32_t uVar2;
  reference pvVar3;
  allocator<unsigned_char> local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  ExtPubkey *this_local;
  
  byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::allocator<unsigned_char>::allocator(&local_31);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_30,4,&local_31);
  ::std::allocator<unsigned_char>::~allocator(&local_31);
  vVar1 = *(value_type *)((long)&this->fingerprint_ + 3);
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_30,3);
  *pvVar3 = vVar1;
  vVar1 = *(value_type *)((long)&this->fingerprint_ + 2);
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_30,2);
  *pvVar3 = vVar1;
  vVar1 = *(value_type *)((long)&this->fingerprint_ + 1);
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_30,1);
  *pvVar3 = vVar1;
  uVar2 = this->fingerprint_;
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_30,0);
  *pvVar3 = (value_type)uVar2;
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData ExtPubkey::GetFingerprintData() const {
  std::vector<uint8_t> byte_data(4);
  byte_data[3] = (fingerprint_ >> 24) & 0xff;
  byte_data[2] = (fingerprint_ >> 16) & 0xff;
  byte_data[1] = (fingerprint_ >> 8) & 0xff;
  byte_data[0] = fingerprint_ & 0xff;
  return ByteData(byte_data);
}